

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_grid.c
# Opt level: O0

REF_STATUS ref_grid_create(REF_GRID *ref_grid_ptr,REF_MPI ref_mpi)

{
  uint uVar1;
  REF_GRID pRVar2;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_GRID ref_grid;
  REF_INT group;
  REF_MPI ref_mpi_local;
  REF_GRID *ref_grid_ptr_local;
  
  pRVar2 = (REF_GRID)malloc(0x110);
  *ref_grid_ptr = pRVar2;
  if (*ref_grid_ptr == (REF_GRID)0x0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",0x21,
           "ref_grid_create","malloc *ref_grid_ptr of REF_GRID_STRUCT NULL");
    ref_grid_ptr_local._4_4_ = 2;
  }
  else {
    pRVar2 = *ref_grid_ptr;
    ref_grid_ptr_local._4_4_ = ref_mpi_deep_copy(&pRVar2->mpi,ref_mpi);
    if (ref_grid_ptr_local._4_4_ == 0) {
      ref_grid_ptr_local._4_4_ = ref_node_create(&pRVar2->node,pRVar2->mpi);
      if (ref_grid_ptr_local._4_4_ == 0) {
        for (ref_grid._4_4_ = REF_CELL_EDG; (int)ref_grid._4_4_ < 0x10;
            ref_grid._4_4_ = ref_grid._4_4_ + REF_CELL_ED2) {
          uVar1 = ref_cell_create(pRVar2->cell + (int)ref_grid._4_4_,ref_grid._4_4_);
          if (uVar1 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",
                   0x2c,"ref_grid_create",(ulong)uVar1,"cell create");
            return uVar1;
          }
        }
        pRVar2->cell[0x10] = (REF_CELL)0x0;
        ref_grid_ptr_local._4_4_ = ref_geom_create(&pRVar2->geom);
        if (ref_grid_ptr_local._4_4_ == 0) {
          ref_grid_ptr_local._4_4_ = ref_gather_create(&pRVar2->gather);
          if (ref_grid_ptr_local._4_4_ == 0) {
            ref_grid_ptr_local._4_4_ = ref_adapt_create(&pRVar2->adapt);
            if (ref_grid_ptr_local._4_4_ == 0) {
              pRVar2->interp = (REF_INTERP)0x0;
              pRVar2->partitioner = REF_MIGRATE_RECOMMENDED;
              pRVar2->partitioner_seed = 0;
              pRVar2->partitioner_full = 0;
              pRVar2->meshb_version = 0;
              pRVar2->coordinate_system = REF_GRID_XBYRZU;
              pRVar2->unit = REF_GRID_M;
              pRVar2->references[0] = 1.0;
              pRVar2->references[1] = 1.0;
              pRVar2->references[2] = 1.0;
              pRVar2->references[3] = 1.0;
              pRVar2->references[4] = 0.0;
              pRVar2->references[5] = 0.0;
              pRVar2->references[6] = 0.0;
              pRVar2->twod = 0;
              pRVar2->surf = 0;
              ref_grid_ptr_local._4_4_ = 0;
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c"
                     ,0x33,"ref_grid_create",(ulong)ref_grid_ptr_local._4_4_,"adapt create");
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",
                   0x32,"ref_grid_create",(ulong)ref_grid_ptr_local._4_4_,"gather create");
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",
                 0x31,"ref_grid_create",(ulong)ref_grid_ptr_local._4_4_,"geom create");
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",0x28
               ,"ref_grid_create",(ulong)ref_grid_ptr_local._4_4_,"node create");
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",0x25,
             "ref_grid_create",(ulong)ref_grid_ptr_local._4_4_,"deep copy ref_mpi");
    }
  }
  return ref_grid_ptr_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_grid_create(REF_GRID *ref_grid_ptr, REF_MPI ref_mpi) {
  REF_INT group;
  REF_GRID ref_grid;

  ref_malloc(*ref_grid_ptr, 1, REF_GRID_STRUCT);

  ref_grid = *ref_grid_ptr;

  RSS(ref_mpi_deep_copy(&ref_grid_mpi(ref_grid), ref_mpi), "deep copy ref_mpi");

  RSS(ref_node_create(&ref_grid_node(ref_grid), ref_grid_mpi(ref_grid)),
      "node create");

  for (group = 0; group < REF_CELL_N_TYPE; group++) {
    RSS(ref_cell_create(&ref_grid_cell(ref_grid, group), (REF_CELL_TYPE)group),
        "cell create");
  }

  ref_grid_cell(ref_grid, REF_CELL_N_TYPE) = NULL;

  RSS(ref_geom_create(&ref_grid_geom(ref_grid)), "geom create");
  RSS(ref_gather_create(&ref_grid_gather(ref_grid)), "gather create");
  RSS(ref_adapt_create(&(ref_grid->adapt)), "adapt create");
  ref_grid_interp(ref_grid) = NULL;

  ref_grid_partitioner(ref_grid) = REF_MIGRATE_RECOMMENDED;
  ref_grid_partitioner_seed(ref_grid) = 0;
  ref_grid_partitioner_full(ref_grid) = REF_FALSE;

  ref_grid_meshb_version(ref_grid) = 0;
  ref_grid_coordinate_system(ref_grid) = REF_GRID_XBYRZU;
  ref_grid_unit(ref_grid) = REF_GRID_M;
  ref_grid_reference(ref_grid, 0) = 1.0;
  ref_grid_reference(ref_grid, 1) = 1.0;
  ref_grid_reference(ref_grid, 2) = 1.0;
  ref_grid_reference(ref_grid, 3) = 1.0;
  ref_grid_reference(ref_grid, 4) = 0.0;
  ref_grid_reference(ref_grid, 5) = 0.0;
  ref_grid_reference(ref_grid, 6) = 0.0;

  ref_grid_twod(ref_grid) = REF_FALSE;
  ref_grid_surf(ref_grid) = REF_FALSE;

  return REF_SUCCESS;
}